

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O2

void Prs_CreateBlifPio(Cba_Ntk_t *p,Prs_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  int f;
  int in_EDX;
  int Fill;
  int Fill_00;
  int iVar3;
  
  Vec_IntFill(&p->vObjFunc,(p->vObjType).nCap,in_EDX);
  Vec_IntFill(&p->vObjName,(p->vObjType).nCap,Fill);
  Vec_IntFill(&p->vFonName,(p->vFonObj).nCap,Fill_00);
  iVar3 = 0;
  while ((iVar3 < (pNtk->vInputs).nSize && (iVar1 = Vec_IntEntry(&pNtk->vInputs,iVar3), iVar1 != 0))
        ) {
    iVar2 = Cba_ObjAlloc(p,CBA_OBJ_PI,0,1);
    Cba_ObjSetName(p,iVar2,iVar1);
    f = Cba_ObjFon0(p,iVar2);
    Cba_FonSetName(p,f,iVar1);
    Cba_NtkSetMap(p,iVar1,f);
    Vec_IntPush(&p->vOrder,iVar2);
    iVar3 = iVar3 + 1;
  }
  iVar3 = 0;
  while( true ) {
    if ((pNtk->vOutputs).nSize <= iVar3) {
      return;
    }
    iVar1 = Vec_IntEntry(&pNtk->vOutputs,iVar3);
    if (iVar1 == 0) break;
    iVar2 = Cba_ObjAlloc(p,CBA_OBJ_PO,1,0);
    Cba_ObjSetName(p,iVar2,iVar1);
    Vec_IntPush(&p->vOrder,iVar2);
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

void Prs_CreateBlifPio( Cba_Ntk_t * p, Prs_Ntk_t * pNtk )
{
    int i, NameId, iObj, iFon;
    Cba_NtkCleanObjFuncs( p );
    Cba_NtkCleanObjNames( p );
    Cba_NtkCleanFonNames( p );
    // create inputs
    Prs_NtkForEachPi( pNtk, NameId, i )
    {
        iObj = Cba_ObjAlloc( p, CBA_OBJ_PI, 0, 1 );
        Cba_ObjSetName( p, iObj, NameId );
        iFon = Cba_ObjFon0(p, iObj);
        Cba_FonSetName( p, iFon, NameId );
        Cba_NtkSetMap( p, NameId, iFon );
        Vec_IntPush( &p->vOrder, iObj );
    }
    // create outputs
    Prs_NtkForEachPo( pNtk, NameId, i )
    {
        iObj = Cba_ObjAlloc( p, CBA_OBJ_PO, 1, 0 );
        Cba_ObjSetName( p, iObj, NameId );
        Vec_IntPush( &p->vOrder, iObj );
    }
}